

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexBilinearFilter::buildKernel
          (PtexBilinearFilter *this,PtexSeparableKernel *k,float u,float v,float uw,float vw,
          Res faceRes)

{
  int iVar1;
  undefined2 in_DX;
  Res *in_RSI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float vfrac;
  float ufrac;
  float vfloor;
  float ufloor;
  float vpix;
  float upix;
  Res res;
  uint8_t vreslog2;
  uint8_t ureslog2;
  Res local_2c;
  int8_t local_2a;
  int8_t local_29;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  Res *local_18;
  undefined2 local_2;
  
  local_28 = in_XMM3_Da;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  local_2 = in_DX;
  local_24 = PtexUtils::min<float>(in_XMM2_Da,1.0);
  local_28 = PtexUtils::min<float>(local_28,1.0);
  fVar3 = local_24;
  fVar2 = PtexUtils::reciprocalPow2((int)(char)local_2);
  local_24 = PtexUtils::max<float>(fVar3,fVar2);
  fVar3 = local_28;
  fVar2 = PtexUtils::reciprocalPow2((int)local_2._1_1_);
  local_28 = PtexUtils::max<float>(fVar3,fVar2);
  iVar1 = PtexUtils::calcResFromWidth(local_24);
  local_29 = (int8_t)iVar1;
  iVar1 = PtexUtils::calcResFromWidth(local_28);
  local_2a = (int8_t)iVar1;
  Res::Res(&local_2c,local_29,local_2a);
  *local_18 = local_2c;
  iVar1 = Res::u(local_18);
  fVar3 = local_1c * (float)iVar1 + -0.5;
  iVar1 = Res::v(local_18);
  fVar2 = local_20 * (float)iVar1 + -0.5;
  dVar4 = std::floor((double)(ulong)(uint)fVar3);
  dVar5 = std::floor((double)(ulong)(uint)fVar2);
  *(int *)(local_18 + 2) = (int)SUB84(dVar4,0);
  *(int *)(local_18 + 4) = (int)SUB84(dVar5,0);
  *(undefined4 *)(local_18 + 6) = 2;
  *(undefined4 *)(local_18 + 8) = 2;
  fVar3 = fVar3 - SUB84(dVar4,0);
  fVar2 = fVar2 - SUB84(dVar5,0);
  **(float **)(local_18 + 0xc) = 1.0 - fVar3;
  *(float *)(*(long *)(local_18 + 0xc) + 4) = fVar3;
  **(float **)(local_18 + 0x10) = 1.0 - fVar2;
  *(float *)(*(long *)(local_18 + 0x10) + 4) = fVar2;
  return;
}

Assistant:

virtual void buildKernel(PtexSeparableKernel& k, float u, float v, float uw, float vw,
                             Res faceRes)
    {
        // clamp filter width to no larger than 1.0
        uw = PtexUtils::min(uw, 1.0f);
        vw = PtexUtils::min(vw, 1.0f);

        // clamp filter width to no smaller than a texel
        uw = PtexUtils::max(uw, PtexUtils::reciprocalPow2(faceRes.ulog2));
        vw = PtexUtils::max(vw, PtexUtils::reciprocalPow2(faceRes.vlog2));

        uint8_t ureslog2 = (uint8_t)PtexUtils::calcResFromWidth(uw);
        uint8_t vreslog2 = (uint8_t)PtexUtils::calcResFromWidth(vw);
        Res res(ureslog2, vreslog2);
        k.res = res;

        // convert from normalized coords to pixel coords
        float upix = u * (float)k.res.u() - 0.5f;
        float vpix = v * (float)k.res.v() - 0.5f;

        float ufloor = PtexUtils::floor(upix);
        float vfloor = PtexUtils::floor(vpix);
        k.u = int(ufloor);
        k.v = int(vfloor);
        k.uw = 2;
        k.vw = 2;

        // compute kernel weights
        float ufrac = upix-ufloor, vfrac = vpix-vfloor;
        k.ku[0] = 1.0f - ufrac;
        k.ku[1] = ufrac;
        k.kv[0] = 1.0f - vfrac;
        k.kv[1] = vfrac;
    }